

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcTransportElement::~IfcTransportElement(IfcTransportElement *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0x8bf348;
  *(undefined8 *)&this->field_0x190 = 0x8bf438;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x88 = 0x8bf370;
  (this->super_IfcElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8bf398;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0x8bf3c0;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.field_0x100 = 0x8bf3e8;
  *(undefined8 *)&(this->super_IfcElement).field_0x138 = 0x8bf410;
  puVar1 = *(undefined1 **)&(this->super_IfcElement).field_0x148;
  if (puVar1 != &this->field_0x158) {
    operator_delete(puVar1,*(long *)&this->field_0x158 + 1);
  }
  IfcElement::~IfcElement(&this->super_IfcElement,&PTR_construction_vtable_24__008bf450);
  operator_delete(this,0x1a8);
  return;
}

Assistant:

IfcTransportElement() : Object("IfcTransportElement") {}